

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazyARA.cpp
# Opt level: O1

void __thiscall LazyARAPlanner::putStateInHeap(LazyARAPlanner *this,LazyARAState *state)

{
  pointer *pppLVar1;
  iterator __position;
  LazyARAState *local_28;
  CKey local_20;
  CKey local_10;
  
  local_28 = state;
  if (state->iteration_closed == this->search_iteration) {
    if (state->in_incons == false) {
      __position._M_current =
           (this->incons).super__Vector_base<LazyARAState_*,_std::allocator<LazyARAState_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->incons).super__Vector_base<LazyARAState_*,_std::allocator<LazyARAState_*>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<LazyARAState*,std::allocator<LazyARAState*>>::
        _M_realloc_insert<LazyARAState*const&>
                  ((vector<LazyARAState*,std::allocator<LazyARAState*>> *)&this->incons,__position,
                   &local_28);
      }
      else {
        *__position._M_current = state;
        pppLVar1 = &(this->incons).
                    super__Vector_base<LazyARAState_*,_std::allocator<LazyARAState_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppLVar1 = *pppLVar1 + 1;
      }
      local_28->in_incons = true;
    }
  }
  else {
    local_20.key[0] = (long)((int)((double)state->h * this->eps) + state->g);
    if ((state->super_AbstractSearchState).heapindex == 0) {
      local_20.key[1] = 0;
      CHeap::insertheap(&this->heap,&state->super_AbstractSearchState,&local_20);
    }
    else {
      local_10.key[1] = 0;
      local_10.key[0] = local_20.key[0];
      CHeap::updateheap(&this->heap,&state->super_AbstractSearchState,&local_10);
    }
  }
  return;
}

Assistant:

void LazyARAPlanner::putStateInHeap(LazyARAState* state)
{
    // we only allow one expansion per search iteration
    // so insert into heap if not closed yet
    if (state->iteration_closed != search_iteration) {
        SBPL_DEBUG("put state %d in open with state->g=%d and state->isTrueCost=%d\n", state->id, state->g, state->isTrueCost);
        CKey key;
        key.key[0] = state->g + int(eps * state->h);
        // if the state is already in the heap, just update its priority
        if (state->heapindex != 0) {
            heap.updateheap(state, key);
        }
        else { // otherwise add it to the heap
            heap.insertheap(state, key);
        }
    }
    // if the state has already been expanded once for this iteration then add
    // it to the incons list so we can keep track of states that we know we have
    // better costs for
    else if (!state->in_incons) {
        SBPL_DEBUG("put state %d in incons with state->g=%d and state->isTrueCost=%d\n", state->id, state->g, state->isTrueCost);
        incons.push_back(state);
        state->in_incons = true;
    }
}